

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

StringList * __thiscall
Rml::DataViewFor::GetVariableNameList_abi_cxx11_
          (StringList *__return_storage_ptr__,DataViewFor *this)

{
  code *pcVar1;
  bool bVar2;
  pointer pDVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pDVar3 = (this->container_address).
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pDVar3 == (this->container_address).
                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = Assert("RMLUI_ASSERT(!container_address.empty())",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                   ,0x23a);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pDVar3 = (this->container_address).
             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  ::std::__cxx11::string::string((string *)&local_30,(string *)pDVar3);
  __l._M_len = 1;
  __l._M_array = &local_30;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__,__l,&local_31);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

StringList DataViewFor::GetVariableNameList() const
{
	RMLUI_ASSERT(!container_address.empty());
	return StringList{container_address.front().name};
}